

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

void __thiscall Omega_h::ExprEnv::ExprEnv(ExprEnv *this,LO size_in,Int dim_in)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Int j;
  long lVar3;
  Int i;
  long lVar4;
  string *psVar5;
  double *pdVar6;
  _Any_data *p_Var7;
  offset_in__Undefined_class_to_subr oVar8;
  bool bVar9;
  byte bVar10;
  pointer pcVar11;
  undefined8 uVar12;
  Matrix<2,_2> a_1;
  Matrix<3,_3> a;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  string local_90 [2];
  storage_union local_48;
  undefined1 *local_38;
  
  bVar10 = 0;
  p_Var7 = &local_b8;
  p_Var1 = &(this->variables)._M_t._M_impl.super__Rb_tree_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->size = size_in;
  this->dim = dim_in;
  paVar2 = &local_90[0].field_2;
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"exp","");
  local_b8._8_8_ = 0;
  local_b8._4_4_ = 0;
  local_b8._0_4_ = size_in;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:668:14)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:668:14)>
             ::_M_manager;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"sqrt","");
  local_b8._8_8_ = 0;
  local_b8._4_4_ = 0;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:670:15)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:670:15)>
             ::_M_manager;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"sin","");
  local_b8._8_8_ = 0;
  local_b8._4_4_ = 0;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:672:14)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:672:14)>
             ::_M_manager;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"cos","");
  local_b8._8_8_ = 0;
  local_b8._4_4_ = 0;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:674:14)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:674:14)>
             ::_M_manager;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"erf","");
  local_b8._8_8_ = 0;
  local_b8._4_4_ = 0;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:676:14)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:676:14)>
             ::_M_manager;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"vector","");
  local_b8._8_8_ = 0;
  oVar8 = CONCAT44(dim_in,size_in);
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:678:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:678:7)>
             ::_M_manager;
  local_b8._M_unused._M_member_pointer = oVar8;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"symm","");
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:680:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:680:7)>
             ::_M_manager;
  local_b8._M_unused._M_member_pointer = oVar8;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"matrix","");
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:682:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:682:7)>
             ::_M_manager;
  local_b8._M_unused._M_member_pointer = oVar8;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"tensor","");
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:684:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:684:7)>
             ::_M_manager;
  local_b8._M_unused._M_member_pointer = oVar8;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"norm","");
  local_b8._8_8_ = 0.0;
  local_b8._M_unused._M_member_pointer = CONCAT44(size_in,dim_in);
  pcStack_a0 = std::
               _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:686:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:686:7)>
             ::_M_manager;
  register_function(this,local_90,(Function *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"d","");
  local_b8._M_unused._0_8_ = (undefined8)(double)this->dim;
  local_a8 = (code *)any::vtable_for_type<double>()::table;
  psVar5 = local_90;
  register_variable(this,psVar5,(any *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (**(code **)(local_a8 + 8))((storage_union *)&local_b8);
    local_a8 = (code *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  if (this->dim == 3) {
    local_b8._M_unused._M_object = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"I","");
    lVar3 = 0;
    do {
      lVar4 = 0;
      do {
        pcVar11 = (pointer)0x3ff0000000000000;
        if (lVar3 != lVar4) {
          pcVar11 = (pointer)0x0;
        }
        (&psVar5->_M_dataplus)[lVar4]._M_p = pcVar11;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar3 = lVar3 + 1;
      psVar5 = (string *)((psVar5->field_2)._M_local_buf + 8);
    } while (lVar3 != 3);
    local_38 = any::vtable_for_type<Omega_h::Matrix<3,3>>()::table;
    local_48.dynamic = operator_new(0x48);
    psVar5 = local_90;
    pdVar6 = (double *)local_48.dynamic;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar6 = (double)(psVar5->_M_dataplus)._M_p;
      psVar5 = (string *)((long)psVar5 + ((ulong)bVar10 * -2 + 1) * 8);
      pdVar6 = pdVar6 + (ulong)bVar10 * -2 + 1;
    }
    register_variable(this,(string *)&local_b8,(any *)&local_48);
    if (local_38 != (undefined1 *)0x0) {
      (**(code **)(local_38 + 8))(&local_48);
      local_38 = (undefined1 *)0x0;
    }
    if ((code **)local_b8._M_unused._0_8_ != &local_a8) {
      operator_delete(local_b8._M_unused._M_object,(ulong)(local_a8 + 1));
    }
  }
  if (this->dim == 2) {
    local_90[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"I","");
    lVar3 = 0;
    do {
      lVar4 = 0;
      do {
        uVar12 = 0x3ff0000000000000;
        if (lVar3 != lVar4) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)p_Var7 + lVar4 * 8) = uVar12;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      p_Var7 = (_Any_data *)((long)p_Var7 + 0x10);
      bVar9 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar9);
    local_38 = any::vtable_for_type<Omega_h::Matrix<2,2>>()::table;
    local_48.dynamic = operator_new(0x20);
    *(code **)((long)local_48.dynamic + 0x10) = local_a8;
    *(code **)((long)local_48.dynamic + 0x18) = pcStack_a0;
    *(void **)local_48.dynamic = local_b8._M_unused._M_object;
    *(undefined8 *)((long)local_48.dynamic + 8) = local_b8._8_8_;
    register_variable(this,local_90,(any *)&local_48);
    if (local_38 != (undefined1 *)0x0) {
      (**(code **)(local_38 + 8))(&local_48);
      local_38 = (undefined1 *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
    }
  }
  if (this->dim == 1) {
    local_90[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"I","");
    local_a8 = (code *)any::vtable_for_type<Omega_h::Matrix<1,1>>()::table;
    local_b8._M_unused._M_member_pointer = 0x3ff0000000000000;
    register_variable(this,local_90,(any *)&local_b8);
    if (local_a8 != (code *)0x0) {
      (**(code **)(local_a8 + 8))((storage_union *)&local_b8);
      local_a8 = (code *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_90[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"pi","");
  local_a8 = (code *)any::vtable_for_type<double>()::table;
  local_b8._M_unused._M_object = (void *)0x400921fb54442d18;
  register_variable(this,local_90,(any *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (**(code **)(local_a8 + 8))((storage_union *)&local_b8);
    local_a8 = (code *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ExprEnv::ExprEnv(LO size_in, Int dim_in) : size(size_in), dim(dim_in) {
  auto local_size = size;
  auto local_dim = dim;
  register_function(
      "exp", [=](Args& args) { return eval_exp(local_size, args); });
  register_function(
      "sqrt", [=](Args& args) { return eval_sqrt(local_size, args); });
  register_function(
      "sin", [=](Args& args) { return eval_sin(local_size, args); });
  register_function(
      "cos", [=](Args& args) { return eval_cos(local_size, args); });
  register_function(
      "erf", [=](Args& args) { return eval_erf(local_size, args); });
  register_function("vector",
      [=](Args& args) { return make_vector(local_size, local_dim, args); });
  register_function("symm",
      [=](Args& args) { return make_symm(local_size, local_dim, args); });
  register_function("matrix",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("tensor",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("norm",
      [=](Args& args) { return eval_norm(local_dim, local_size, args); });
  register_variable("d", any(Real(dim)));
  if (dim == 3) register_variable("I", any(identity_matrix<3, 3>()));
  if (dim == 2) register_variable("I", any(identity_matrix<2, 2>()));
  if (dim == 1) register_variable("I", any(identity_matrix<1, 1>()));
  register_variable("pi", any(Real(Omega_h::PI)));
}